

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DomeLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,DomeLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr p_Var2;
  uint uVar3;
  string *this;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  const_iterator cVar8;
  mapped_type *this_00;
  _Base_ptr p_Var9;
  char *pcVar10;
  bool bVar11;
  char *pcVar12;
  string *psVar13;
  _Rb_tree_header *p_Var14;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_3b0;
  undefined1 local_390 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  string *local_368;
  long *local_360 [2];
  long local_350 [2];
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_340;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_338;
  string *local_330;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  _Base_ptr local_2f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2f0;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_2e8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_2e0;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_2d8;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_2d0;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_2c8;
  _Base_ptr local_2c0;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_2b8;
  undefined1 local_2b0 [16];
  code *local_2a0;
  code *pcStack_298;
  ios_base local_240 [264];
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_328._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_328._M_impl.super__Rb_tree_header._M_header;
  local_328._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar11 = false;
  local_328._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_328._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_368 = err;
  local_328._M_impl.super__Rb_tree_header._M_header._M_right =
       local_328._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_328,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar4) {
    p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar11 = true;
    if ((_Rb_tree_header *)p_Var9 != p_Var14) {
      local_2b8 = &light->guideRadius;
      local_2c8 = &(light->super_NonboundableLight).diffuse;
      local_2d0 = &(light->super_NonboundableLight).specular;
      local_2d8 = &(light->super_NonboundableLight).colorTemperature;
      local_2e0 = &(light->super_NonboundableLight).color;
      local_2e8 = &(light->super_NonboundableLight).intensity;
      local_2f0 = &(light->super_NonboundableLight).props;
      local_340 = &(light->super_NonboundableLight).purpose;
      local_338 = &(light->super_NonboundableLight).visibility;
      local_330 = warn;
      local_2c0 = &p_Var14->_M_header;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        prop = (Property *)(p_Var9 + 2);
        local_2b0._0_8_ = &local_2a0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"guideRadius","");
        psVar13 = (string *)local_2b0;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_390,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_328,&local_98,prop,(string *)local_2b0,local_2b8);
        if ((code **)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar5 = 0;
        if ((local_390._0_8_ & 0xfffffffd) == 0) {
          iVar5 = 3;
LAB_00210f78:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (local_390._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd3e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_360[0] = local_350;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_360,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[12],std::__cxx11::string>
                      (&local_3b0,(fmt *)local_360,(string *)0x5ddf8a,(char (*) [12])(local_390 + 8)
                       ,psVar13);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2b0,local_3b0._M_dataplus._M_p,
                                local_3b0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
              operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1
                             );
            }
            psVar13 = local_368;
            if (local_360[0] != local_350) {
              operator_delete(local_360[0],local_350[0] + 1);
            }
            if (psVar13 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar7 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_360,(ulong)(psVar13->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_3b0.field_2._M_allocated_capacity = *psVar1;
                local_3b0.field_2._8_8_ = plVar7[3];
                local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              }
              else {
                local_3b0.field_2._M_allocated_capacity = *psVar1;
                local_3b0._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_3b0._M_string_length = plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_3b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base(local_240);
            iVar5 = 1;
            goto LAB_00210f78;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._8_8_ != &local_378) {
          operator_delete((void *)local_390._8_8_,local_378._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:diffuse","")
          ;
          psVar13 = (string *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_390,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_328,&local_b8,prop,(string *)local_2b0,local_2c8);
          if ((code **)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_390._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_00211273:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_390._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd3f);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_360[0] = local_350;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[15],std::__cxx11::string>
                        (&local_3b0,(fmt *)local_360,(string *)"inputs:diffuse",
                         (char (*) [15])(local_390 + 8),psVar13);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2b0,local_3b0._M_dataplus._M_p,
                                  local_3b0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              psVar13 = local_368;
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
              if (psVar13 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_360,(ulong)(psVar13->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0.field_2._8_8_ = plVar7[3];
                  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                }
                else {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_3b0._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_3b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                  operator_delete(local_3b0._M_dataplus._M_p,
                                  local_3b0.field_2._M_allocated_capacity + 1);
                }
                if (local_360[0] != local_350) {
                  operator_delete(local_360[0],local_350[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
              ::std::ios_base::~ios_base(local_240);
              iVar5 = 1;
              goto LAB_00211273;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._8_8_ != &local_378) {
            operator_delete((void *)local_390._8_8_,local_378._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_0021295d;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,"inputs:specular","");
          psVar13 = (string *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_390,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_328,&local_d8,prop,(string *)local_2b0,local_2d0);
          if ((code **)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_390._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_0021156e:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_390._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd41);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_360[0] = local_350;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[16],std::__cxx11::string>
                        (&local_3b0,(fmt *)local_360,(string *)"inputs:specular",
                         (char (*) [16])(local_390 + 8),psVar13);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2b0,local_3b0._M_dataplus._M_p,
                                  local_3b0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              psVar13 = local_368;
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
              if (psVar13 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_360,(ulong)(psVar13->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0.field_2._8_8_ = plVar7[3];
                  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                }
                else {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_3b0._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_3b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                  operator_delete(local_3b0._M_dataplus._M_p,
                                  local_3b0.field_2._M_allocated_capacity + 1);
                }
                if (local_360[0] != local_350) {
                  operator_delete(local_360[0],local_350[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
              ::std::ios_base::~ios_base(local_240);
              iVar5 = 1;
              goto LAB_0021156e;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._8_8_ != &local_378) {
            operator_delete((void *)local_390._8_8_,local_378._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_0021295d;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,"inputs:colorTemperature","");
          psVar13 = (string *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_390,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_328,&local_f8,prop,(string *)local_2b0,local_2d8);
          if ((code **)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_390._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_00211869:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_390._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd43);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_360[0] = local_350;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[24],std::__cxx11::string>
                        (&local_3b0,(fmt *)local_360,(string *)"inputs:colorTemperature",
                         (char (*) [24])(local_390 + 8),psVar13);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2b0,local_3b0._M_dataplus._M_p,
                                  local_3b0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              psVar13 = local_368;
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
              if (psVar13 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_360,(ulong)(psVar13->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0.field_2._8_8_ = plVar7[3];
                  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                }
                else {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_3b0._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_3b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                  operator_delete(local_3b0._M_dataplus._M_p,
                                  local_3b0.field_2._M_allocated_capacity + 1);
                }
                if (local_360[0] != local_350) {
                  operator_delete(local_360[0],local_350[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
              ::std::ios_base::~ios_base(local_240);
              iVar5 = 1;
              goto LAB_00211869;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._8_8_ != &local_378) {
            operator_delete((void *)local_390._8_8_,local_378._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_0021295d;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:color","");
          psVar13 = (string *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                    ((ParseResult *)local_390,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_328,&local_118,prop,(string *)local_2b0,local_2e0);
          if ((code **)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_390._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_00211b64:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_390._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd44);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_360[0] = local_350;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        (&local_3b0,(fmt *)local_360,(string *)"inputs:color",
                         (char (*) [13])(local_390 + 8),psVar13);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2b0,local_3b0._M_dataplus._M_p,
                                  local_3b0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              psVar13 = local_368;
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
              if (psVar13 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_360,(ulong)(psVar13->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0.field_2._8_8_ = plVar7[3];
                  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                }
                else {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_3b0._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_3b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                  operator_delete(local_3b0._M_dataplus._M_p,
                                  local_3b0.field_2._M_allocated_capacity + 1);
                }
                if (local_360[0] != local_350) {
                  operator_delete(local_360[0],local_350[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
              ::std::ios_base::~ios_base(local_240);
              iVar5 = 1;
              goto LAB_00211b64;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._8_8_ != &local_378) {
            operator_delete((void *)local_390._8_8_,local_378._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_0021295d;
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,"inputs:intensity","");
          psVar13 = (string *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_390,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_328,&local_138,prop,(string *)local_2b0,local_2e8);
          if ((code **)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_390._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_00211e5f:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_390._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd46);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_360[0] = local_350;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[17],std::__cxx11::string>
                        (&local_3b0,(fmt *)local_360,(string *)"inputs:intensity",
                         (char (*) [17])(local_390 + 8),psVar13);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2b0,local_3b0._M_dataplus._M_p,
                                  local_3b0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              psVar13 = local_368;
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
              if (psVar13 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_360,(ulong)(psVar13->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0.field_2._8_8_ = plVar7[3];
                  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                }
                else {
                  local_3b0.field_2._M_allocated_capacity = *psVar1;
                  local_3b0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_3b0._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_3b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                  operator_delete(local_3b0._M_dataplus._M_p,
                                  local_3b0.field_2._M_allocated_capacity + 1);
                }
                if (local_360[0] != local_350) {
                  operator_delete(local_360[0],local_350[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
              ::std::ios_base::~ios_base(local_240);
              iVar5 = 1;
              goto LAB_00211e5f;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._8_8_ != &local_378) {
            operator_delete((void *)local_390._8_8_,local_378._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_0021295d;
          p_Var2 = p_Var9 + 1;
          iVar5 = ::std::__cxx11::string::compare((char *)p_Var2);
          if (iVar5 == 0) {
            local_2b0._0_8_ = &local_2a0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"visibility","");
            cVar8 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_328,(string *)local_2b0);
            if ((code **)local_2b0._0_8_ != &local_2a0) {
              operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
            }
            psVar13 = local_330;
            if ((_Rb_tree_header *)cVar8._M_node == &local_328._M_impl.super__Rb_tree_header) {
              if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_2b0,(Attribute *)prop);
                local_390._0_8_ = local_390 + 0x10;
                local_390[0x14] = 'n';
                local_390._16_4_ = 0x656b6f74;
                local_390._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_390[0x15] = '\0';
                if (((local_2b0._8_8_ == 5) &&
                    ((char)*(int *)(local_2b0._0_8_ + 4) == 'n' &&
                     *(int *)local_2b0._0_8_ == 0x656b6f74)) &&
                   (uVar3 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar3 < 2)) {
                  if ((code **)local_2b0._0_8_ != &local_2a0) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
                  }
                  if (uVar3 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,"():",3);
                    poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd48);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,"\n",1);
                    if (psVar13 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_390,&local_3b0,local_368);
                      ::std::__cxx11::string::operator=((string *)psVar13,(string *)local_390);
                      if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                        operator_delete((void *)local_390._0_8_,
                                        CONCAT26(local_390._22_2_,
                                                 CONCAT15(local_390[0x15],
                                                          CONCAT14(local_390[0x14],local_390._16_4_)
                                                         )) + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                        operator_delete(local_3b0._M_dataplus._M_p,
                                        local_3b0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
                    ::std::ios_base::~ios_base(local_240);
                    AttrMetas::operator=(&local_338->_metas,(AttrMetas *)(p_Var9 + 7));
                    pcVar12 = "visibility";
                    pcVar10 = "";
LAB_00212607:
                    local_2b0._0_8_ = &local_2a0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b0,pcVar12,pcVar10);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_328,(string *)local_2b0);
                    if ((code **)local_2b0._0_8_ != &local_2a0) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
                    }
                    goto LAB_00212968;
                  }
                }
                else if ((code **)local_2b0._0_8_ != &local_2a0) {
                  operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
                }
              }
              local_2b0._8_8_ = 0;
              local_2b0._0_8_ = VisibilityEnumHandler;
              pcStack_298 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_2a0 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              local_390._0_8_ = local_390 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"visibility","")
              ;
              bVar4 = options->strict_allowedToken_check;
              local_48 = (code *)0x0;
              pcStack_40 = (code *)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              if (local_2a0 != (code *)0x0) {
                (*local_2a0)(&local_58,(string *)local_2b0,2);
                local_48 = local_2a0;
                pcStack_40 = pcStack_298;
              }
              bVar4 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                ((string *)local_390,bVar4,
                                 (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,(Attribute *)prop
                                 ,local_338,psVar13,local_368);
              if (local_48 != (code *)0x0) {
                (*local_48)(&local_58,&local_58,__destroy_functor);
              }
              if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                operator_delete((void *)local_390._0_8_,
                                CONCAT26(local_390._22_2_,
                                         CONCAT15(local_390[0x15],
                                                  CONCAT14(local_390[0x14],local_390._16_4_))) + 1);
              }
              iVar5 = 1;
              if (bVar4) {
                AttrMetas::operator=(&local_338->_metas,(AttrMetas *)(p_Var9 + 7));
                pcVar12 = "visibility";
                pcVar10 = "";
LAB_00212911:
                local_390._0_8_ = local_390 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_390,pcVar12,pcVar10);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_390);
                if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                  operator_delete((void *)local_390._0_8_,
                                  CONCAT26(local_390._22_2_,
                                           CONCAT15(local_390[0x15],
                                                    CONCAT14(local_390[0x14],local_390._16_4_))) + 1
                                 );
                }
                iVar5 = 3;
              }
LAB_00212943:
              if (local_2a0 != (code *)0x0) {
                (*local_2a0)((string *)local_2b0,(string *)local_2b0,3);
              }
              goto LAB_0021295d;
            }
          }
          else {
            local_2f8 = p_Var2;
            iVar5 = ::std::__cxx11::string::compare((char *)p_Var2);
            p_Var2 = local_2f8;
            if (iVar5 == 0) {
              local_2b0._0_8_ = &local_2a0;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"purpose","");
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_328,(string *)local_2b0);
              if ((code **)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
              }
              psVar13 = local_330;
              if ((_Rb_tree_header *)cVar8._M_node == &local_328._M_impl.super__Rb_tree_header) {
                if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_2b0,(Attribute *)prop);
                  local_390._0_8_ = local_390 + 0x10;
                  local_390[0x14] = 'n';
                  local_390._16_4_ = 0x656b6f74;
                  local_390._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_390[0x15] = '\0';
                  if (((local_2b0._8_8_ == 5) &&
                      ((char)*(int *)(local_2b0._0_8_ + 4) == 'n' &&
                       *(int *)local_2b0._0_8_ == 0x656b6f74)) &&
                     (uVar3 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar3 < 2)) {
                    if ((code **)local_2b0._0_8_ != &local_2a0) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
                    }
                    if (uVar3 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,"():",3);
                      poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd4a);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,"purpose",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,"\n",1);
                      if (psVar13 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_390,&local_3b0,local_368);
                        ::std::__cxx11::string::operator=((string *)psVar13,(string *)local_390);
                        if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                          operator_delete((void *)local_390._0_8_,
                                          CONCAT26(local_390._22_2_,
                                                   CONCAT15(local_390[0x15],
                                                            CONCAT14(local_390[0x14],
                                                                     local_390._16_4_))) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                          operator_delete(local_3b0._M_dataplus._M_p,
                                          local_3b0.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
                      ::std::ios_base::~ios_base(local_240);
                      AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var9 + 7));
                      pcVar12 = "purpose";
                      pcVar10 = "";
                      goto LAB_00212607;
                    }
                  }
                  else if ((code **)local_2b0._0_8_ != &local_2a0) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)((long)local_2a0 + 1));
                  }
                }
                local_2b0._8_8_ = 0;
                local_2b0._0_8_ = PurposeEnumHandler;
                pcStack_298 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_2a0 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_390._0_8_ = local_390 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"purpose","");
                bVar4 = options->strict_allowedToken_check;
                local_68 = (code *)0x0;
                pcStack_60 = (code *)0x0;
                local_78._M_unused._M_object = (void *)0x0;
                local_78._8_8_ = 0;
                if (local_2a0 != (code *)0x0) {
                  (*local_2a0)(&local_78,(string *)local_2b0,2);
                  local_68 = local_2a0;
                  pcStack_60 = pcStack_298;
                }
                bVar4 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  ((string *)local_390,bVar4,
                                   (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,(Attribute *)prop,
                                   local_340,psVar13,local_368);
                if (local_68 != (code *)0x0) {
                  (*local_68)(&local_78,&local_78,__destroy_functor);
                }
                if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                  operator_delete((void *)local_390._0_8_,
                                  CONCAT26(local_390._22_2_,
                                           CONCAT15(local_390[0x15],
                                                    CONCAT14(local_390[0x14],local_390._16_4_))) + 1
                                 );
                }
                iVar5 = 1;
                if (bVar4) {
                  AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var9 + 7));
                  pcVar12 = "purpose";
                  pcVar10 = "";
                  goto LAB_00212911;
                }
                goto LAB_00212943;
              }
            }
            else {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_328,(key_type *)local_2f8);
              p_Var14 = &local_328._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar8._M_node == p_Var14) {
                this_00 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_2f0,(key_type *)p_Var2);
                Property::operator=(this_00,prop);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var2);
              }
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_328,(key_type *)p_Var2);
              if ((_Rb_tree_header *)cVar8._M_node == p_Var14) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b0,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b0,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
                poVar6 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0xd4c);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_390,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var2);
                poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_2b0,(char *)local_390._0_8_,local_390._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                  operator_delete((void *)local_390._0_8_,
                                  CONCAT26(local_390._22_2_,
                                           CONCAT15(local_390[0x15],
                                                    CONCAT14(local_390[0x14],local_390._16_4_))) + 1
                                 );
                }
                this = local_330;
                psVar13 = local_368;
                if (local_330 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_390,&local_3b0,psVar13);
                  ::std::__cxx11::string::operator=((string *)this,(string *)local_390);
                  if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                    operator_delete((void *)local_390._0_8_,
                                    CONCAT26(local_390._22_2_,
                                             CONCAT15(local_390[0x15],
                                                      CONCAT14(local_390[0x14],local_390._16_4_))) +
                                    1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                    operator_delete(local_3b0._M_dataplus._M_p,
                                    local_3b0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
                ::std::ios_base::~ios_base(local_240);
              }
            }
          }
        }
        else {
LAB_0021295d:
          if ((iVar5 != 3) && (iVar5 != 0)) {
            bVar11 = false;
            goto LAB_0021298a;
          }
        }
LAB_00212968:
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while (p_Var9 != local_2c0);
      bVar11 = true;
    }
  }
LAB_0021298a:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_328,(_Link_type)local_328._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar11;
}

Assistant:

bool ReconstructPrim<DomeLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DomeLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "guideRadius", DomeLight, light->guideRadius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:diffuse", DomeLight, light->diffuse)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:specular", DomeLight,
                   light->specular)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:colorTemperature", DomeLight,
                   light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", DomeLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", DomeLight,
                   light->intensity)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DomeLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DomeLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, DomeLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("Implement DomeLight");
  return true;
}